

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cxx17_string_view.cpp
# Opt level: O1

void __thiscall
iu_StringViewSplit_x_iutest_x_chain_conv_func_by_c_str_Test<char>::Body
          (iu_StringViewSplit_x_iutest_x_chain_conv_func_by_c_str_Test<char> *this)

{
  int iVar1;
  char *in_R9;
  vector<unsigned_long,_std::allocator<unsigned_long>_> sv_hash;
  vector<unsigned_long,_std::allocator<unsigned_long>_> s_hash;
  basic_string_view<char,_std::char_traits<char>_> sv;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> s;
  AssertionResult iutest_ar;
  allocator<char> local_279;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_278;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_260;
  string local_248;
  basic_string_view<char,_std::char_traits<char>_> local_228;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_218;
  undefined1 *local_1f8;
  undefined8 local_1f0;
  undefined1 local_1e8;
  undefined7 uStack_1e7;
  char local_1d8;
  AssertionHelper local_1d0;
  undefined1 local_1a0 [392];
  
  local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_218,"arikitari na_world!","");
  local_228._M_len = local_218._M_string_length;
  local_228._M_str = local_218._M_dataplus._M_p;
  local_1a0._0_8_ = "_ ";
  ::detail::
  operator|<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_yumetodo[P]string_split_test_test_cxx17_string_view_cpp:425:70),_true,_false,_nullptr>
            (&local_260,&local_218,
             (split_helper_conv_func<const_char_*,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_yumetodo[P]string_split_test_test_cxx17_string_view_cpp:425:70),_false,_true,_false>
              *)local_1a0);
  local_1a0._0_8_ = "_ ";
  ::detail::
  operator|<std::basic_string_view<char,_std::char_traits<char>_>,_const_char_*,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_yumetodo[P]string_split_test_test_cxx17_string_view_cpp:428:72),_true,_false,_nullptr>
            (&local_278,&local_228,
             (split_helper_conv_func<const_char_*,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_yumetodo[P]string_split_test_test_cxx17_string_view_cpp:428:72),_false,_true,_false>
              *)local_1a0);
  if ((long)local_260.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)local_260.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start ==
      (long)local_278.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)local_278.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start) {
    if (local_260.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        local_260.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start) {
      local_1d8 = true;
    }
    else {
      iVar1 = bcmp(local_260.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_start,
                   local_278.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_start,
                   (long)local_260.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)local_260.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                         ._M_impl.super__Vector_impl_data._M_start);
      local_1d8 = iVar1 == 0;
    }
  }
  else {
    local_1d8 = false;
  }
  local_1f0 = 0;
  local_1e8 = 0;
  local_1f8 = &local_1e8;
  if ((bool)local_1d8 == false) {
    memset((iu_global_format_stringstream *)local_1a0,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_1a0);
    iutest::internal::GetBooleanAssertionFailureMessage_abi_cxx11_
              (&local_248,(internal *)&local_1f8,
               (AssertionResult *)
               "std::equal(s_hash.begin(), s_hash.end(), sv_hash.begin(), sv_hash.end())","false",
               "true",in_R9);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1d0,local_248._M_dataplus._M_p,&local_279);
    local_1d0.m_part_result.super_iuCodeMessage.m_file =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/yumetodo[P]string_split/test/test_cxx17_string_view.cpp"
    ;
    local_1d0.m_part_result.super_iuCodeMessage.m_line = 0x1b2;
    local_1d0.m_part_result.super_iuCodeMessage._44_4_ = 2;
    iutest::AssertionHelper::OnFixed(&local_1d0,(Fixed *)local_1a0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d0.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p !=
        &local_1d0.m_part_result.super_iuCodeMessage.m_message.field_2) {
      operator_delete(local_1d0.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                      local_1d0.m_part_result.super_iuCodeMessage.m_message.field_2.
                      _M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_248._M_dataplus._M_p != &local_248.field_2) {
      operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1a0);
    std::ios_base::~ios_base((ios_base *)(local_1a0 + 0x80));
  }
  if (local_1f8 != &local_1e8) {
    operator_delete(local_1f8,CONCAT71(uStack_1e7,local_1e8) + 1);
  }
  if (local_278.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_278.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_278.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_278.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_260.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_260.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_260.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_260.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_218._M_dataplus._M_p != &local_218.field_2) {
    operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

IUTEST_TYPED_TEST(StringViewSplit, chain_at_last_by_stl_str)
{
	using char_type = TypeParam;
	const std::basic_string_view<char_type> s = constant::arikitari_na_world_underscore<char_type>();
	const auto re = s | split(std::basic_string<char_type>(constant::space_underscore<char_type>())) >> at_last();
	IUTEST_ASSERT(2u == re.size());
	IUTEST_ASSERT_EQ(constant::arikitari_na<char_type>(), re[0]);
	IUTEST_ASSERT_EQ(constant::world<char_type>(), re[1]);
}